

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteCustomRuleBOD(cmGlobalGhsMultiGenerator *this,ostream *fout)

{
  std::operator<<(fout,
                  "Commands {\n  Custom_Rule_Command {\n    name = \"Custom Rule Command\"\n    exec = \""
                 );
  std::operator<<(fout,"/bin/sh");
  std::operator<<(fout,"\"\n    options = {\"SpecialOptions\"}\n  }\n}\n");
  std::operator<<(fout,"\n\n");
  std::operator<<(fout,
                  "FileTypes {\n  CmakeRule {\n    name = \"Custom Rule\"\n    action = \"&Run\"\n    extensions = {\""
                 );
  std::operator<<(fout,"sh");
  std::operator<<(fout,
                  "\"}\n    grepable = false\n    command = \"Custom Rule Command\"\n    commandLine = \"$COMMAND "
                 );
  std::operator<<(fout,
                  " $INPUTFILE\"\n    progress = \"Processing Custom Rule\"\n    promoteToFirstPass = true\n    outputType = \"None\"\n    color = \"#800080\"\n  }\n}\n"
                 );
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteCustomRuleBOD(std::ostream& fout)
{
  fout << "Commands {\n"
          "  Custom_Rule_Command {\n"
          "    name = \"Custom Rule Command\"\n"
          "    exec = \"";
#ifdef _WIN32
  fout << "cmd.exe";
#else
  fout << "/bin/sh";
#endif
  fout << "\"\n"
          "    options = {\"SpecialOptions\"}\n"
          "  }\n"
          "}\n";

  fout << "\n\n";
  fout << "FileTypes {\n"
          "  CmakeRule {\n"
          "    name = \"Custom Rule\"\n"
          "    action = \"&Run\"\n"
          "    extensions = {\"";
#ifdef _WIN32
  fout << "bat";
#else
  fout << "sh";
#endif
  fout << "\"}\n"
          "    grepable = false\n"
          "    command = \"Custom Rule Command\"\n"
          "    commandLine = \"$COMMAND ";
#ifdef _WIN32
  fout << "/c";
#endif
  fout << " $INPUTFILE\"\n"
          "    progress = \"Processing Custom Rule\"\n"
          "    promoteToFirstPass = true\n"
          "    outputType = \"None\"\n"
          "    color = \"#800080\"\n"
          "  }\n"
          "}\n";
}